

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testConversion.cpp
# Opt level: O2

void testConversion(string *tempDir)

{
  uint *puVar1;
  uint *puVar2;
  float *pfVar3;
  float fVar4;
  ushort uVar5;
  _Alloc_hider _Var6;
  bool bVar7;
  int iVar8;
  int iVar9;
  ostream *poVar10;
  Compression *pCVar11;
  ChannelList *pCVar12;
  int y;
  ulong uVar13;
  uint *puVar14;
  char *pcVar15;
  ulong uVar16;
  long lVar17;
  int x;
  long lVar18;
  uint *puVar19;
  ulong in_R10;
  int y_6;
  long lVar20;
  Compression CVar21;
  ulong uVar22;
  int y_10;
  long lVar23;
  Array2D<unsigned_int> inPixels;
  Array2D<unsigned_int> outPixels;
  OutputFile out;
  Header hdr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  ulong local_38;
  
  poVar10 = std::operator<<((ostream *)&std::cout,"Testing conversion between pixel data types");
  std::endl<char,std::char_traits<char>>(poVar10);
  poVar10 = std::operator<<((ostream *)&std::cout,"individual numbers");
  std::endl<char,std::char_traits<char>>(poVar10);
  anon_unknown.dwarf_978d0::testFloatToUint(0,0);
  anon_unknown.dwarf_978d0::testFloatToUint(0x3f000000,0);
  anon_unknown.dwarf_978d0::testFloatToUint(0xbf000000,0);
  anon_unknown.dwarf_978d0::testFloatToUint(0x42f82000,0x7c);
  anon_unknown.dwarf_978d0::testFloatToUint(0xc2f82000,0);
  anon_unknown.dwarf_978d0::testFloatToUint(0x58635fa9,0xffffffff);
  anon_unknown.dwarf_978d0::testFloatToUint(0xd8635fa9,0);
  anon_unknown.dwarf_978d0::testFloatToUint(0x7f800000,0xffffffff);
  anon_unknown.dwarf_978d0::testFloatToUint(0xff800000,0);
  anon_unknown.dwarf_978d0::testFloatToUint(0x7fffffff,0);
  anon_unknown.dwarf_978d0::testFloatToUint(0xffffffff,0);
  anon_unknown.dwarf_978d0::testHalfToUint(0,0);
  anon_unknown.dwarf_978d0::testHalfToUint(0x3800,0);
  anon_unknown.dwarf_978d0::testHalfToUint(0xb800,0);
  anon_unknown.dwarf_978d0::testHalfToUint(0x57c1,0x7c);
  anon_unknown.dwarf_978d0::testHalfToUint(0xd7c1,0);
  anon_unknown.dwarf_978d0::testHalfToUint(0x7c00,0xffffffff);
  anon_unknown.dwarf_978d0::testHalfToUint(0xfc00,0);
  anon_unknown.dwarf_978d0::testHalfToUint(0x7fff,0);
  anon_unknown.dwarf_978d0::testHalfToUint(0xffff,0);
  anon_unknown.dwarf_978d0::testFloatToHalf(0,0);
  anon_unknown.dwarf_978d0::testFloatToHalf(0x3f000000,0x3800);
  anon_unknown.dwarf_978d0::testFloatToHalf(0xbf000000,0xb800);
  anon_unknown.dwarf_978d0::testFloatToHalf(0x42f82000,0x57c1);
  anon_unknown.dwarf_978d0::testFloatToHalf(0xc2f82000,0xd7c1);
  anon_unknown.dwarf_978d0::testFloatToHalf(0x58635fa9,0x7c00);
  anon_unknown.dwarf_978d0::testFloatToHalf(0xd8635fa9,0xfc00);
  anon_unknown.dwarf_978d0::testFloatToHalf(0x7f800000,0x7c00);
  anon_unknown.dwarf_978d0::testFloatToHalf(0xff800000,0xfc00);
  anon_unknown.dwarf_978d0::testFloatToHalf(0x7fffffff,0x7fff);
  anon_unknown.dwarf_978d0::testFloatToHalf(0xffffffff,0xffff);
  anon_unknown.dwarf_978d0::testUintToHalf(0,0);
  anon_unknown.dwarf_978d0::testUintToHalf(1,0x3c00);
  anon_unknown.dwarf_978d0::testUintToHalf(0x7c,0x57c0);
  anon_unknown.dwarf_978d0::testUintToHalf(1000000,0x7c00);
  anon_unknown.dwarf_978d0::testUintToHalf(0xffffffff,0x7c00);
  poVar10 = std::operator<<((ostream *)&std::cout,
                            "conversion of image channels while reading a file ");
  std::endl<char,std::char_traits<char>>(poVar10);
  uVar22 = 0;
  do {
    CVar21 = (Compression)uVar22;
    if (CVar21 == NUM_COMPRESSION_METHODS) {
      poVar10 = std::operator<<((ostream *)&std::cout,"ok\n");
      std::endl<char,std::char_traits<char>>(poVar10);
      return;
    }
    if ((CVar21 & (DWAA_COMPRESSION|B44_COMPRESSION)) != B44_COMPRESSION) {
      std::operator+(&local_58,tempDir,"imf_test_conv.exr");
      _Var6._M_p = local_58._M_dataplus._M_p;
      poVar10 = std::operator<<((ostream *)&std::cout,"scan lines, compression ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,CVar21);
      poVar10 = std::operator<<(poVar10,", ");
      poVar10 = std::operator<<(poVar10,"output type ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,0);
      poVar10 = std::operator<<(poVar10,", ");
      poVar10 = std::operator<<(poVar10,"input type ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,0);
      std::operator<<(poVar10,":\n    ");
      std::ostream::flush();
      outPixels._sizeX = 0x21b;
      outPixels._sizeY = 0x13d;
      outPixels._data = (uint *)operator_new__(0xa6dbc);
      puVar14 = outPixels._data;
      for (uVar13 = 0; uVar13 != 0x21b; uVar13 = uVar13 + 1) {
        uVar16 = uVar13 & 0xffffffff;
        for (lVar18 = 0; lVar18 != 0x13d; lVar18 = lVar18 + 1) {
          puVar14[lVar18] = (uint)uVar16;
          uVar16 = (ulong)((uint)uVar16 + 10);
        }
        puVar14 = puVar14 + 0x13d;
      }
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      Imf_2_5::Header::Header(&hdr,0x13d,0x21b,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar11 = Imf_2_5::Header::compression(&hdr);
      *pCVar11 = CVar21;
      pCVar12 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,UINT,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar12,"X",(Channel *)&out);
      inPixels._sizeY = inPixels._sizeY & 0xffffffff00000000;
      inPixels._data = (uint *)0x0;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,UINT,(char *)outPixels._data,4,0x4f4,1,1,0.0,SUB81(in_R10,0),
                 (bool)((char)&inPixels + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&inPixels,"X",(Slice *)&out);
      std::operator<<((ostream *)&std::cout,"writing ");
      std::ostream::flush();
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::OutputFile::OutputFile(&out,_Var6._M_p,&hdr,iVar8);
      Imf_2_5::OutputFile::setFrameBuffer(&out,(FrameBuffer *)&inPixels);
      Imf_2_5::OutputFile::writePixels(&out,0x21b);
      Imf_2_5::OutputFile::~OutputFile(&out);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&inPixels);
      Imf_2_5::Header::~Header(&hdr);
      inPixels._sizeX = 0x21b;
      inPixels._sizeY = 0x13d;
      inPixels._data = (uint *)operator_new__(0xa6dbc);
      std::operator<<((ostream *)&std::cout,"reading ");
      std::ostream::flush();
      out._data = (Data *)((ulong)out._data & 0xffffffff00000000);
      Imf_2_5::Slice::Slice
                ((Slice *)&hdr,UINT,(char *)inPixels._data,4,0x4f4,1,1,0.0,SUB81(in_R10,0),
                 (bool)((char)&out + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"X",(Slice *)&hdr);
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::InputFile::InputFile((InputFile *)&hdr,_Var6._M_p,iVar8);
      Imf_2_5::InputFile::setFrameBuffer((InputFile *)&hdr,(FrameBuffer *)&out);
      Imf_2_5::InputFile::readPixels((InputFile *)&hdr,0,0x21a);
      Imf_2_5::InputFile::~InputFile((InputFile *)&hdr);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&out);
      std::operator<<((ostream *)&std::cout,"comparing");
      std::ostream::flush();
      puVar14 = inPixels._data;
      puVar19 = outPixels._data;
      for (lVar18 = 0; lVar18 != 0x21b; lVar18 = lVar18 + 1) {
        uVar13 = 0;
        while (uVar13 != 0x13d) {
          puVar1 = puVar14 + uVar13;
          in_R10 = uVar13 + 1;
          puVar2 = puVar19 + uVar13;
          uVar13 = in_R10;
          if (*puVar1 != *puVar2) {
            pcVar15 = 
            "void (anonymous namespace)::testScanLineImageChannel(const char *, int, int, Compression) [OutType = unsigned int, OutTypeTag = Imf_2_5::UINT, InType = unsigned int, InTypeTag = Imf_2_5::UINT]"
            ;
            goto LAB_00130ce1;
          }
        }
        puVar19 = puVar19 + outPixels._sizeY;
        puVar14 = puVar14 + inPixels._sizeY;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      remove(_Var6._M_p);
      Imf_2_5::Array2D<unsigned_int>::~Array2D(&inPixels);
      Imf_2_5::Array2D<unsigned_int>::~Array2D(&outPixels);
      _Var6._M_p = local_58._M_dataplus._M_p;
      poVar10 = std::operator<<((ostream *)&std::cout,"tiles, compression ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,CVar21);
      poVar10 = std::operator<<(poVar10,", ");
      poVar10 = std::operator<<(poVar10,"output type ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,0);
      poVar10 = std::operator<<(poVar10,", ");
      poVar10 = std::operator<<(poVar10,"input type ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,0);
      std::operator<<(poVar10,":\n    ");
      std::ostream::flush();
      outPixels._sizeX = 0x21b;
      outPixels._sizeY = 0x13d;
      outPixels._data = (uint *)operator_new__(0xa6dbc);
      puVar14 = outPixels._data;
      for (uVar13 = 0; uVar13 != 0x21b; uVar13 = uVar13 + 1) {
        uVar16 = uVar13 & 0xffffffff;
        for (lVar18 = 0; lVar18 != 0x13d; lVar18 = lVar18 + 1) {
          puVar14[lVar18] = (uint)uVar16;
          uVar16 = (ulong)((uint)uVar16 + 10);
        }
        puVar14 = puVar14 + 0x13d;
      }
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      Imf_2_5::Header::Header(&hdr,0x13d,0x21b,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x4300000043;
      out._data = (Data *)0x0;
      Imf_2_5::Header::setTileDescription(&hdr,(TileDescription *)&out);
      pCVar11 = Imf_2_5::Header::compression(&hdr);
      *pCVar11 = CVar21;
      pCVar12 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,UINT,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar12,"X",(Channel *)&out);
      inPixels._sizeY = inPixels._sizeY & 0xffffffff00000000;
      inPixels._data = (uint *)0x0;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,UINT,(char *)outPixels._data,4,0x4f4,1,1,0.0,SUB81(in_R10,0),
                 (bool)((char)&inPixels + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&inPixels,"X",(Slice *)&out);
      std::operator<<((ostream *)&std::cout,"writing ");
      std::ostream::flush();
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&out,_Var6._M_p,&hdr,iVar8);
      Imf_2_5::TiledOutputFile::setFrameBuffer((TiledOutputFile *)&out,(FrameBuffer *)&inPixels);
      iVar8 = Imf_2_5::TiledOutputFile::numXTiles((TiledOutputFile *)&out,0);
      iVar9 = Imf_2_5::TiledOutputFile::numYTiles((TiledOutputFile *)&out,0);
      Imf_2_5::TiledOutputFile::writeTiles((TiledOutputFile *)&out,0,iVar8 + -1,0,iVar9 + -1,0);
      Imf_2_5::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&out);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&inPixels);
      Imf_2_5::Header::~Header(&hdr);
      inPixels._sizeX = 0x21b;
      inPixels._sizeY = 0x13d;
      inPixels._data = (uint *)operator_new__(0xa6dbc);
      std::operator<<((ostream *)&std::cout,"reading ");
      std::ostream::flush();
      out._data = (Data *)((ulong)out._data & 0xffffffff00000000);
      Imf_2_5::Slice::Slice
                ((Slice *)&hdr,UINT,(char *)inPixels._data,4,0x4f4,1,1,0.0,SUB81(in_R10,0),
                 (bool)((char)&out + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"X",(Slice *)&hdr);
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledInputFile::TiledInputFile((TiledInputFile *)&hdr,_Var6._M_p,iVar8);
      Imf_2_5::TiledInputFile::setFrameBuffer((TiledInputFile *)&hdr,(FrameBuffer *)&out);
      iVar8 = Imf_2_5::TiledInputFile::numXTiles((TiledInputFile *)&hdr,0);
      iVar9 = Imf_2_5::TiledInputFile::numYTiles((TiledInputFile *)&hdr,0);
      Imf_2_5::TiledInputFile::readTiles((TiledInputFile *)&hdr,0,iVar8 + -1,0,iVar9 + -1,0);
      Imf_2_5::TiledInputFile::~TiledInputFile((TiledInputFile *)&hdr);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&out);
      std::operator<<((ostream *)&std::cout,"comparing");
      std::ostream::flush();
      puVar14 = inPixels._data;
      puVar19 = outPixels._data;
      for (lVar18 = 0; lVar18 != 0x21b; lVar18 = lVar18 + 1) {
        uVar13 = 0;
        while (uVar13 != 0x13d) {
          puVar1 = puVar14 + uVar13;
          in_R10 = uVar13 + 1;
          puVar2 = puVar19 + uVar13;
          uVar13 = in_R10;
          if (*puVar1 != *puVar2) {
            pcVar15 = 
            "void (anonymous namespace)::testTiledImageChannel(const char *, int, int, Compression) [OutType = unsigned int, OutTypeTag = Imf_2_5::UINT, InType = unsigned int, InTypeTag = Imf_2_5::UINT]"
            ;
            goto LAB_00130d00;
          }
        }
        puVar19 = puVar19 + outPixels._sizeY;
        puVar14 = puVar14 + inPixels._sizeY;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      remove(_Var6._M_p);
      Imf_2_5::Array2D<unsigned_int>::~Array2D(&inPixels);
      Imf_2_5::Array2D<unsigned_int>::~Array2D(&outPixels);
      std::__cxx11::string::~string((string *)&local_58);
      std::operator+(&local_58,tempDir,"imf_test_conv.exr");
      _Var6._M_p = local_58._M_dataplus._M_p;
      poVar10 = std::operator<<((ostream *)&std::cout,"scan lines, compression ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,CVar21);
      poVar10 = std::operator<<(poVar10,", ");
      poVar10 = std::operator<<(poVar10,"output type ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,0);
      poVar10 = std::operator<<(poVar10,", ");
      poVar10 = std::operator<<(poVar10,"input type ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,1);
      std::operator<<(poVar10,":\n    ");
      std::ostream::flush();
      outPixels._sizeX = 0x21b;
      outPixels._sizeY = 0x13d;
      outPixels._data = (uint *)operator_new__(0xa6dbc);
      puVar14 = outPixels._data;
      for (uVar13 = 0; uVar13 != 0x21b; uVar13 = uVar13 + 1) {
        uVar16 = uVar13 & 0xffffffff;
        for (lVar18 = 0; lVar18 != 0x13d; lVar18 = lVar18 + 1) {
          puVar14[lVar18] = (uint)uVar16;
          uVar16 = (ulong)((uint)uVar16 + 10);
        }
        puVar14 = puVar14 + 0x13d;
      }
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      Imf_2_5::Header::Header(&hdr,0x13d,0x21b,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar11 = Imf_2_5::Header::compression(&hdr);
      *pCVar11 = CVar21;
      pCVar12 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,UINT,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar12,"X",(Channel *)&out);
      inPixels._sizeY = inPixels._sizeY & 0xffffffff00000000;
      inPixels._data = (uint *)0x0;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,UINT,(char *)outPixels._data,4,0x4f4,1,1,0.0,SUB81(in_R10,0),
                 (bool)((char)&inPixels + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&inPixels,"X",(Slice *)&out);
      std::operator<<((ostream *)&std::cout,"writing ");
      std::ostream::flush();
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::OutputFile::OutputFile(&out,_Var6._M_p,&hdr,iVar8);
      Imf_2_5::OutputFile::setFrameBuffer(&out,(FrameBuffer *)&inPixels);
      Imf_2_5::OutputFile::writePixels(&out,0x21b);
      Imf_2_5::OutputFile::~OutputFile(&out);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&inPixels);
      Imf_2_5::Header::~Header(&hdr);
      inPixels._sizeX = 0x21b;
      inPixels._sizeY = 0x13d;
      inPixels._data = (uint *)operator_new__(0x536de);
      std::operator<<((ostream *)&std::cout,"reading ");
      std::ostream::flush();
      out._data = (Data *)((ulong)out._data & 0xffffffff00000000);
      Imf_2_5::Slice::Slice
                ((Slice *)&hdr,HALF,(char *)inPixels._data,2,0x27a,1,1,0.0,SUB81(in_R10,0),
                 (bool)((char)&out + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"X",(Slice *)&hdr);
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::InputFile::InputFile((InputFile *)&hdr,_Var6._M_p,iVar8);
      Imf_2_5::InputFile::setFrameBuffer((InputFile *)&hdr,(FrameBuffer *)&out);
      Imf_2_5::InputFile::readPixels((InputFile *)&hdr,0,0x21a);
      Imf_2_5::InputFile::~InputFile((InputFile *)&hdr);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&out);
      std::operator<<((ostream *)&std::cout,"comparing");
      std::ostream::flush();
      lVar20 = 0;
      lVar23 = 0;
      local_38 = uVar22;
      for (lVar18 = 0; lVar18 != 0x21b; lVar18 = lVar18 + 1) {
        lVar17 = 0;
        while (lVar17 != 0x13d) {
          uVar5 = *(ushort *)((long)inPixels._data + lVar17 * 2 + inPixels._sizeY * lVar20);
          half::half((half *)&hdr,
                     (float)*(uint *)((long)outPixels._data + lVar17 * 4 + outPixels._sizeY * lVar23
                                     ));
          fVar4 = *(float *)((long)&half::_toFloat + (ulong)uVar5 * 4);
          lVar17 = lVar17 + 1;
          pfVar3 = (float *)((long)&half::_toFloat + (ulong)(ushort)hdr._map._M_t._M_impl._0_2_ * 4)
          ;
          if ((fVar4 != *pfVar3) || (uVar22 = local_38, NAN(fVar4) || NAN(*pfVar3))) {
            pcVar15 = 
            "void (anonymous namespace)::testScanLineImageChannel(const char *, int, int, Compression) [OutType = unsigned int, OutTypeTag = Imf_2_5::UINT, InType = half, InTypeTag = Imf_2_5::HALF]"
            ;
            goto LAB_00130ce1;
          }
        }
        lVar23 = lVar23 + 4;
        lVar20 = lVar20 + 2;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      remove(_Var6._M_p);
      Imf_2_5::Array2D<half>::~Array2D((Array2D<half> *)&inPixels);
      Imf_2_5::Array2D<unsigned_int>::~Array2D(&outPixels);
      _Var6._M_p = local_58._M_dataplus._M_p;
      poVar10 = std::operator<<((ostream *)&std::cout,"tiles, compression ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,(Compression)uVar22);
      poVar10 = std::operator<<(poVar10,", ");
      poVar10 = std::operator<<(poVar10,"output type ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,0);
      poVar10 = std::operator<<(poVar10,", ");
      poVar10 = std::operator<<(poVar10,"input type ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,1);
      std::operator<<(poVar10,":\n    ");
      std::ostream::flush();
      outPixels._sizeX = 0x21b;
      outPixels._sizeY = 0x13d;
      outPixels._data = (uint *)operator_new__(0xa6dbc);
      puVar14 = outPixels._data;
      for (uVar13 = 0; uVar13 != 0x21b; uVar13 = uVar13 + 1) {
        uVar16 = uVar13 & 0xffffffff;
        for (lVar18 = 0; lVar18 != 0x13d; lVar18 = lVar18 + 1) {
          puVar14[lVar18] = (uint)uVar16;
          uVar16 = (ulong)((uint)uVar16 + 10);
        }
        puVar14 = puVar14 + 0x13d;
      }
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      Imf_2_5::Header::Header(&hdr,0x13d,0x21b,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x4300000043;
      out._data = (Data *)0x0;
      Imf_2_5::Header::setTileDescription(&hdr,(TileDescription *)&out);
      pCVar11 = Imf_2_5::Header::compression(&hdr);
      *pCVar11 = (Compression)uVar22;
      pCVar12 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,UINT,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar12,"X",(Channel *)&out);
      inPixels._sizeY = inPixels._sizeY & 0xffffffff00000000;
      inPixels._data = (uint *)0x0;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,UINT,(char *)outPixels._data,4,0x4f4,1,1,0.0,SUB81(in_R10,0),
                 (bool)((char)&inPixels + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&inPixels,"X",(Slice *)&out);
      std::operator<<((ostream *)&std::cout,"writing ");
      std::ostream::flush();
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&out,_Var6._M_p,&hdr,iVar8);
      Imf_2_5::TiledOutputFile::setFrameBuffer((TiledOutputFile *)&out,(FrameBuffer *)&inPixels);
      iVar8 = Imf_2_5::TiledOutputFile::numXTiles((TiledOutputFile *)&out,0);
      iVar9 = Imf_2_5::TiledOutputFile::numYTiles((TiledOutputFile *)&out,0);
      Imf_2_5::TiledOutputFile::writeTiles((TiledOutputFile *)&out,0,iVar8 + -1,0,iVar9 + -1,0);
      Imf_2_5::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&out);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&inPixels);
      Imf_2_5::Header::~Header(&hdr);
      inPixels._sizeX = 0x21b;
      inPixels._sizeY = 0x13d;
      inPixels._data = (uint *)operator_new__(0x536de);
      std::operator<<((ostream *)&std::cout,"reading ");
      std::ostream::flush();
      out._data = (Data *)((ulong)out._data & 0xffffffff00000000);
      Imf_2_5::Slice::Slice
                ((Slice *)&hdr,HALF,(char *)inPixels._data,2,0x27a,1,1,0.0,SUB81(in_R10,0),
                 (bool)((char)&out + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"X",(Slice *)&hdr);
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledInputFile::TiledInputFile((TiledInputFile *)&hdr,_Var6._M_p,iVar8);
      Imf_2_5::TiledInputFile::setFrameBuffer((TiledInputFile *)&hdr,(FrameBuffer *)&out);
      iVar8 = Imf_2_5::TiledInputFile::numXTiles((TiledInputFile *)&hdr,0);
      iVar9 = Imf_2_5::TiledInputFile::numYTiles((TiledInputFile *)&hdr,0);
      Imf_2_5::TiledInputFile::readTiles((TiledInputFile *)&hdr,0,iVar8 + -1,0,iVar9 + -1,0);
      Imf_2_5::TiledInputFile::~TiledInputFile((TiledInputFile *)&hdr);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&out);
      std::operator<<((ostream *)&std::cout,"comparing");
      std::ostream::flush();
      lVar20 = 0;
      lVar23 = 0;
      for (lVar18 = 0; lVar18 != 0x21b; lVar18 = lVar18 + 1) {
        lVar17 = 0;
        while (lVar17 != 0x13d) {
          uVar5 = *(ushort *)((long)inPixels._data + lVar17 * 2 + inPixels._sizeY * lVar20);
          half::half((half *)&hdr,
                     (float)*(uint *)((long)outPixels._data + lVar17 * 4 + outPixels._sizeY * lVar23
                                     ));
          fVar4 = *(float *)((long)&half::_toFloat + (ulong)uVar5 * 4);
          lVar17 = lVar17 + 1;
          pfVar3 = (float *)((long)&half::_toFloat + (ulong)(ushort)hdr._map._M_t._M_impl._0_2_ * 4)
          ;
          if ((fVar4 != *pfVar3) || (uVar22 = local_38, NAN(fVar4) || NAN(*pfVar3))) {
            pcVar15 = 
            "void (anonymous namespace)::testTiledImageChannel(const char *, int, int, Compression) [OutType = unsigned int, OutTypeTag = Imf_2_5::UINT, InType = half, InTypeTag = Imf_2_5::HALF]"
            ;
            goto LAB_00130d00;
          }
        }
        lVar23 = lVar23 + 4;
        lVar20 = lVar20 + 2;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      remove(_Var6._M_p);
      Imf_2_5::Array2D<half>::~Array2D((Array2D<half> *)&inPixels);
      Imf_2_5::Array2D<unsigned_int>::~Array2D(&outPixels);
      std::__cxx11::string::~string((string *)&local_58);
      std::operator+(&local_58,tempDir,"imf_test_conv.exr");
      _Var6._M_p = local_58._M_dataplus._M_p;
      poVar10 = std::operator<<((ostream *)&std::cout,"scan lines, compression ");
      CVar21 = (Compression)uVar22;
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,CVar21);
      poVar10 = std::operator<<(poVar10,", ");
      poVar10 = std::operator<<(poVar10,"output type ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,0);
      poVar10 = std::operator<<(poVar10,", ");
      poVar10 = std::operator<<(poVar10,"input type ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,2);
      std::operator<<(poVar10,":\n    ");
      std::ostream::flush();
      outPixels._sizeX = 0x21b;
      outPixels._sizeY = 0x13d;
      outPixels._data = (uint *)operator_new__(0xa6dbc);
      puVar14 = outPixels._data;
      for (uVar13 = 0; uVar13 != 0x21b; uVar13 = uVar13 + 1) {
        uVar16 = uVar13 & 0xffffffff;
        for (lVar18 = 0; lVar18 != 0x13d; lVar18 = lVar18 + 1) {
          puVar14[lVar18] = (uint)uVar16;
          uVar16 = (ulong)((uint)uVar16 + 10);
        }
        puVar14 = puVar14 + 0x13d;
      }
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      Imf_2_5::Header::Header(&hdr,0x13d,0x21b,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar11 = Imf_2_5::Header::compression(&hdr);
      *pCVar11 = CVar21;
      pCVar12 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,UINT,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar12,"X",(Channel *)&out);
      inPixels._sizeY = inPixels._sizeY & 0xffffffff00000000;
      inPixels._data = (uint *)0x0;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,UINT,(char *)outPixels._data,4,0x4f4,1,1,0.0,SUB81(in_R10,0),
                 (bool)((char)&inPixels + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&inPixels,"X",(Slice *)&out);
      std::operator<<((ostream *)&std::cout,"writing ");
      std::ostream::flush();
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::OutputFile::OutputFile(&out,_Var6._M_p,&hdr,iVar8);
      Imf_2_5::OutputFile::setFrameBuffer(&out,(FrameBuffer *)&inPixels);
      Imf_2_5::OutputFile::writePixels(&out,0x21b);
      Imf_2_5::OutputFile::~OutputFile(&out);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&inPixels);
      Imf_2_5::Header::~Header(&hdr);
      inPixels._sizeX = 0x21b;
      inPixels._sizeY = 0x13d;
      inPixels._data = (uint *)operator_new__(0xa6dbc);
      std::operator<<((ostream *)&std::cout,"reading ");
      std::ostream::flush();
      out._data = (Data *)((ulong)out._data & 0xffffffff00000000);
      Imf_2_5::Slice::Slice
                ((Slice *)&hdr,FLOAT,(char *)inPixels._data,4,0x4f4,1,1,0.0,SUB81(in_R10,0),
                 (bool)((char)&out + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"X",(Slice *)&hdr);
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::InputFile::InputFile((InputFile *)&hdr,_Var6._M_p,iVar8);
      Imf_2_5::InputFile::setFrameBuffer((InputFile *)&hdr,(FrameBuffer *)&out);
      Imf_2_5::InputFile::readPixels((InputFile *)&hdr,0,0x21a);
      Imf_2_5::InputFile::~InputFile((InputFile *)&hdr);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&out);
      std::operator<<((ostream *)&std::cout,"comparing");
      std::ostream::flush();
      lVar18 = 0;
      for (lVar20 = 0; lVar20 != 0x21b; lVar20 = lVar20 + 1) {
        lVar23 = 0;
        while (lVar23 != 0x13d) {
          bVar7 = equivalent(*(float *)((long)inPixels._data + lVar23 * 4 + inPixels._sizeY * lVar18
                                       ),
                             (float)*(uint *)((long)outPixels._data +
                                             lVar23 * 4 + outPixels._sizeY * lVar18),CVar21);
          lVar23 = lVar23 + 1;
          if (!bVar7) {
            pcVar15 = 
            "void (anonymous namespace)::testScanLineImageChannel(const char *, int, int, Compression) [OutType = unsigned int, OutTypeTag = Imf_2_5::UINT, InType = float, InTypeTag = Imf_2_5::FLOAT]"
            ;
            goto LAB_00130ce1;
          }
        }
        lVar18 = lVar18 + 4;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      remove(_Var6._M_p);
      Imf_2_5::Array2D<float>::~Array2D((Array2D<float> *)&inPixels);
      Imf_2_5::Array2D<unsigned_int>::~Array2D(&outPixels);
      _Var6._M_p = local_58._M_dataplus._M_p;
      poVar10 = std::operator<<((ostream *)&std::cout,"tiles, compression ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,CVar21);
      poVar10 = std::operator<<(poVar10,", ");
      poVar10 = std::operator<<(poVar10,"output type ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,0);
      poVar10 = std::operator<<(poVar10,", ");
      poVar10 = std::operator<<(poVar10,"input type ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,2);
      std::operator<<(poVar10,":\n    ");
      std::ostream::flush();
      outPixels._sizeX = 0x21b;
      outPixels._sizeY = 0x13d;
      outPixels._data = (uint *)operator_new__(0xa6dbc);
      puVar14 = outPixels._data;
      for (uVar13 = 0; uVar13 != 0x21b; uVar13 = uVar13 + 1) {
        uVar16 = uVar13 & 0xffffffff;
        for (lVar18 = 0; lVar18 != 0x13d; lVar18 = lVar18 + 1) {
          puVar14[lVar18] = (uint)uVar16;
          uVar16 = (ulong)((uint)uVar16 + 10);
        }
        puVar14 = puVar14 + 0x13d;
      }
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      Imf_2_5::Header::Header(&hdr,0x13d,0x21b,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x4300000043;
      out._data = (Data *)0x0;
      Imf_2_5::Header::setTileDescription(&hdr,(TileDescription *)&out);
      pCVar11 = Imf_2_5::Header::compression(&hdr);
      *pCVar11 = CVar21;
      pCVar12 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,UINT,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar12,"X",(Channel *)&out);
      inPixels._sizeY = inPixels._sizeY & 0xffffffff00000000;
      inPixels._data = (uint *)0x0;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,UINT,(char *)outPixels._data,4,0x4f4,1,1,0.0,SUB81(in_R10,0),
                 (bool)((char)&inPixels + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&inPixels,"X",(Slice *)&out);
      std::operator<<((ostream *)&std::cout,"writing ");
      std::ostream::flush();
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&out,_Var6._M_p,&hdr,iVar8);
      Imf_2_5::TiledOutputFile::setFrameBuffer((TiledOutputFile *)&out,(FrameBuffer *)&inPixels);
      iVar8 = Imf_2_5::TiledOutputFile::numXTiles((TiledOutputFile *)&out,0);
      iVar9 = Imf_2_5::TiledOutputFile::numYTiles((TiledOutputFile *)&out,0);
      Imf_2_5::TiledOutputFile::writeTiles((TiledOutputFile *)&out,0,iVar8 + -1,0,iVar9 + -1,0);
      Imf_2_5::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&out);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&inPixels);
      Imf_2_5::Header::~Header(&hdr);
      inPixels._sizeX = 0x21b;
      inPixels._sizeY = 0x13d;
      inPixels._data = (uint *)operator_new__(0xa6dbc);
      std::operator<<((ostream *)&std::cout,"reading ");
      std::ostream::flush();
      out._data = (Data *)((ulong)out._data & 0xffffffff00000000);
      Imf_2_5::Slice::Slice
                ((Slice *)&hdr,FLOAT,(char *)inPixels._data,4,0x4f4,1,1,0.0,SUB81(in_R10,0),
                 (bool)((char)&out + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"X",(Slice *)&hdr);
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledInputFile::TiledInputFile((TiledInputFile *)&hdr,_Var6._M_p,iVar8);
      Imf_2_5::TiledInputFile::setFrameBuffer((TiledInputFile *)&hdr,(FrameBuffer *)&out);
      iVar8 = Imf_2_5::TiledInputFile::numXTiles((TiledInputFile *)&hdr,0);
      iVar9 = Imf_2_5::TiledInputFile::numYTiles((TiledInputFile *)&hdr,0);
      Imf_2_5::TiledInputFile::readTiles((TiledInputFile *)&hdr,0,iVar8 + -1,0,iVar9 + -1,0);
      Imf_2_5::TiledInputFile::~TiledInputFile((TiledInputFile *)&hdr);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&out);
      std::operator<<((ostream *)&std::cout,"comparing");
      std::ostream::flush();
      lVar18 = 0;
      for (lVar20 = 0; lVar20 != 0x21b; lVar20 = lVar20 + 1) {
        lVar23 = 0;
        while (lVar23 != 0x13d) {
          bVar7 = equivalent(*(float *)((long)inPixels._data + lVar23 * 4 + inPixels._sizeY * lVar18
                                       ),
                             (float)*(uint *)((long)outPixels._data +
                                             lVar23 * 4 + outPixels._sizeY * lVar18),CVar21);
          lVar23 = lVar23 + 1;
          if (!bVar7) {
            pcVar15 = 
            "void (anonymous namespace)::testTiledImageChannel(const char *, int, int, Compression) [OutType = unsigned int, OutTypeTag = Imf_2_5::UINT, InType = float, InTypeTag = Imf_2_5::FLOAT]"
            ;
            goto LAB_00130d00;
          }
        }
        lVar18 = lVar18 + 4;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      remove(_Var6._M_p);
      Imf_2_5::Array2D<float>::~Array2D((Array2D<float> *)&inPixels);
      Imf_2_5::Array2D<unsigned_int>::~Array2D(&outPixels);
      std::__cxx11::string::~string((string *)&local_58);
      std::operator+(&local_58,tempDir,"imf_test_conv.exr");
      _Var6._M_p = local_58._M_dataplus._M_p;
      poVar10 = std::operator<<((ostream *)&std::cout,"scan lines, compression ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,CVar21);
      poVar10 = std::operator<<(poVar10,", ");
      poVar10 = std::operator<<(poVar10,"output type ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,1);
      poVar10 = std::operator<<(poVar10,", ");
      poVar10 = std::operator<<(poVar10,"input type ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,0);
      std::operator<<(poVar10,":\n    ");
      std::ostream::flush();
      outPixels._sizeX = 0x21b;
      outPixels._sizeY = 0x13d;
      outPixels._data = (uint *)operator_new__(0x536de);
      lVar18 = 0;
      for (uVar13 = 0; uVar13 != 0x21b; uVar13 = uVar13 + 1) {
        uVar16 = uVar13 & 0xffffffff;
        for (lVar20 = 0; lVar20 != 0x27a; lVar20 = lVar20 + 2) {
          half::operator=((half *)((long)outPixels._data + lVar20 + outPixels._sizeY * lVar18),
                          (float)(int)uVar16);
          uVar16 = (ulong)((int)uVar16 + 10);
        }
        lVar18 = lVar18 + 2;
      }
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      Imf_2_5::Header::Header(&hdr,0x13d,0x21b,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar11 = Imf_2_5::Header::compression(&hdr);
      *pCVar11 = CVar21;
      pCVar12 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar12,"X",(Channel *)&out);
      inPixels._sizeY = inPixels._sizeY & 0xffffffff00000000;
      inPixels._data = (uint *)0x0;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,HALF,(char *)outPixels._data,2,0x27a,1,1,0.0,SUB81(in_R10,0),
                 (bool)((char)&inPixels + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&inPixels,"X",(Slice *)&out);
      std::operator<<((ostream *)&std::cout,"writing ");
      std::ostream::flush();
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::OutputFile::OutputFile(&out,_Var6._M_p,&hdr,iVar8);
      Imf_2_5::OutputFile::setFrameBuffer(&out,(FrameBuffer *)&inPixels);
      Imf_2_5::OutputFile::writePixels(&out,0x21b);
      Imf_2_5::OutputFile::~OutputFile(&out);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&inPixels);
      Imf_2_5::Header::~Header(&hdr);
      inPixels._sizeX = 0x21b;
      inPixels._sizeY = 0x13d;
      inPixels._data = (uint *)operator_new__(0xa6dbc);
      std::operator<<((ostream *)&std::cout,"reading ");
      std::ostream::flush();
      out._data = (Data *)((ulong)out._data & 0xffffffff00000000);
      Imf_2_5::Slice::Slice
                ((Slice *)&hdr,UINT,(char *)inPixels._data,4,0x4f4,1,1,0.0,SUB81(in_R10,0),
                 (bool)((char)&out + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"X",(Slice *)&hdr);
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::InputFile::InputFile((InputFile *)&hdr,_Var6._M_p,iVar8);
      Imf_2_5::InputFile::setFrameBuffer((InputFile *)&hdr,(FrameBuffer *)&out);
      Imf_2_5::InputFile::readPixels((InputFile *)&hdr,0,0x21a);
      Imf_2_5::InputFile::~InputFile((InputFile *)&hdr);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&out);
      std::operator<<((ostream *)&std::cout,"comparing");
      std::ostream::flush();
      puVar14 = inPixels._data;
      puVar19 = outPixels._data;
      for (lVar18 = 0; lVar18 != 0x21b; lVar18 = lVar18 + 1) {
        uVar13 = 0;
        while (uVar13 != 0x13d) {
          lVar20 = uVar13 * 2;
          in_R10 = uVar13 + 1;
          puVar1 = puVar14 + uVar13;
          uVar13 = in_R10;
          if (*puVar1 !=
              (uint)(long)*(float *)((long)&half::_toFloat +
                                    (ulong)*(ushort *)((long)puVar19 + lVar20) * 4)) {
            pcVar15 = 
            "void (anonymous namespace)::testScanLineImageChannel(const char *, int, int, Compression) [OutType = half, OutTypeTag = Imf_2_5::HALF, InType = unsigned int, InTypeTag = Imf_2_5::UINT]"
            ;
            goto LAB_00130ce1;
          }
        }
        puVar19 = (uint *)((long)puVar19 + outPixels._sizeY * 2);
        puVar14 = puVar14 + inPixels._sizeY;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      remove(_Var6._M_p);
      Imf_2_5::Array2D<unsigned_int>::~Array2D(&inPixels);
      Imf_2_5::Array2D<half>::~Array2D((Array2D<half> *)&outPixels);
      _Var6._M_p = local_58._M_dataplus._M_p;
      poVar10 = std::operator<<((ostream *)&std::cout,"tiles, compression ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,CVar21);
      poVar10 = std::operator<<(poVar10,", ");
      poVar10 = std::operator<<(poVar10,"output type ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,1);
      poVar10 = std::operator<<(poVar10,", ");
      poVar10 = std::operator<<(poVar10,"input type ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,0);
      std::operator<<(poVar10,":\n    ");
      std::ostream::flush();
      outPixels._sizeX = 0x21b;
      outPixels._sizeY = 0x13d;
      outPixels._data = (uint *)operator_new__(0x536de);
      lVar18 = 0;
      for (uVar13 = 0; uVar13 != 0x21b; uVar13 = uVar13 + 1) {
        uVar16 = uVar13 & 0xffffffff;
        for (lVar20 = 0; lVar20 != 0x27a; lVar20 = lVar20 + 2) {
          half::operator=((half *)((long)outPixels._data + lVar20 + outPixels._sizeY * lVar18),
                          (float)(int)uVar16);
          uVar16 = (ulong)((int)uVar16 + 10);
        }
        lVar18 = lVar18 + 2;
      }
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      Imf_2_5::Header::Header(&hdr,0x13d,0x21b,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x4300000043;
      out._data = (Data *)0x0;
      Imf_2_5::Header::setTileDescription(&hdr,(TileDescription *)&out);
      pCVar11 = Imf_2_5::Header::compression(&hdr);
      *pCVar11 = CVar21;
      pCVar12 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar12,"X",(Channel *)&out);
      inPixels._sizeY = inPixels._sizeY & 0xffffffff00000000;
      inPixels._data = (uint *)0x0;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,HALF,(char *)outPixels._data,2,0x27a,1,1,0.0,SUB81(in_R10,0),
                 (bool)((char)&inPixels + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&inPixels,"X",(Slice *)&out);
      std::operator<<((ostream *)&std::cout,"writing ");
      std::ostream::flush();
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&out,_Var6._M_p,&hdr,iVar8);
      Imf_2_5::TiledOutputFile::setFrameBuffer((TiledOutputFile *)&out,(FrameBuffer *)&inPixels);
      iVar8 = Imf_2_5::TiledOutputFile::numXTiles((TiledOutputFile *)&out,0);
      iVar9 = Imf_2_5::TiledOutputFile::numYTiles((TiledOutputFile *)&out,0);
      Imf_2_5::TiledOutputFile::writeTiles((TiledOutputFile *)&out,0,iVar8 + -1,0,iVar9 + -1,0);
      Imf_2_5::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&out);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&inPixels);
      Imf_2_5::Header::~Header(&hdr);
      inPixels._sizeX = 0x21b;
      inPixels._sizeY = 0x13d;
      inPixels._data = (uint *)operator_new__(0xa6dbc);
      std::operator<<((ostream *)&std::cout,"reading ");
      std::ostream::flush();
      out._data = (Data *)((ulong)out._data & 0xffffffff00000000);
      Imf_2_5::Slice::Slice
                ((Slice *)&hdr,UINT,(char *)inPixels._data,4,0x4f4,1,1,0.0,SUB81(in_R10,0),
                 (bool)((char)&out + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"X",(Slice *)&hdr);
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledInputFile::TiledInputFile((TiledInputFile *)&hdr,_Var6._M_p,iVar8);
      Imf_2_5::TiledInputFile::setFrameBuffer((TiledInputFile *)&hdr,(FrameBuffer *)&out);
      iVar8 = Imf_2_5::TiledInputFile::numXTiles((TiledInputFile *)&hdr,0);
      iVar9 = Imf_2_5::TiledInputFile::numYTiles((TiledInputFile *)&hdr,0);
      Imf_2_5::TiledInputFile::readTiles((TiledInputFile *)&hdr,0,iVar8 + -1,0,iVar9 + -1,0);
      Imf_2_5::TiledInputFile::~TiledInputFile((TiledInputFile *)&hdr);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&out);
      std::operator<<((ostream *)&std::cout,"comparing");
      std::ostream::flush();
      puVar14 = inPixels._data;
      puVar19 = outPixels._data;
      for (lVar18 = 0; lVar18 != 0x21b; lVar18 = lVar18 + 1) {
        uVar13 = 0;
        while (uVar13 != 0x13d) {
          lVar20 = uVar13 * 2;
          in_R10 = uVar13 + 1;
          puVar1 = puVar14 + uVar13;
          uVar13 = in_R10;
          if (*puVar1 !=
              (uint)(long)*(float *)((long)&half::_toFloat +
                                    (ulong)*(ushort *)((long)puVar19 + lVar20) * 4)) {
            pcVar15 = 
            "void (anonymous namespace)::testTiledImageChannel(const char *, int, int, Compression) [OutType = half, OutTypeTag = Imf_2_5::HALF, InType = unsigned int, InTypeTag = Imf_2_5::UINT]"
            ;
            goto LAB_00130d00;
          }
        }
        puVar19 = (uint *)((long)puVar19 + outPixels._sizeY * 2);
        puVar14 = puVar14 + inPixels._sizeY;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      remove(_Var6._M_p);
      Imf_2_5::Array2D<unsigned_int>::~Array2D(&inPixels);
      Imf_2_5::Array2D<half>::~Array2D((Array2D<half> *)&outPixels);
      std::__cxx11::string::~string((string *)&local_58);
      std::operator+(&local_58,tempDir,"imf_test_conv.exr");
      _Var6._M_p = local_58._M_dataplus._M_p;
      poVar10 = std::operator<<((ostream *)&std::cout,"scan lines, compression ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,CVar21);
      poVar10 = std::operator<<(poVar10,", ");
      poVar10 = std::operator<<(poVar10,"output type ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,1);
      poVar10 = std::operator<<(poVar10,", ");
      poVar10 = std::operator<<(poVar10,"input type ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,1);
      std::operator<<(poVar10,":\n    ");
      std::ostream::flush();
      outPixels._sizeX = 0x21b;
      outPixels._sizeY = 0x13d;
      outPixels._data = (uint *)operator_new__(0x536de);
      lVar18 = 0;
      for (uVar13 = 0; uVar13 != 0x21b; uVar13 = uVar13 + 1) {
        uVar16 = uVar13 & 0xffffffff;
        for (lVar20 = 0; lVar20 != 0x27a; lVar20 = lVar20 + 2) {
          half::operator=((half *)((long)outPixels._data + lVar20 + outPixels._sizeY * lVar18),
                          (float)(int)uVar16);
          uVar16 = (ulong)((int)uVar16 + 10);
        }
        lVar18 = lVar18 + 2;
      }
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      Imf_2_5::Header::Header(&hdr,0x13d,0x21b,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar11 = Imf_2_5::Header::compression(&hdr);
      *pCVar11 = CVar21;
      pCVar12 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar12,"X",(Channel *)&out);
      inPixels._sizeY = inPixels._sizeY & 0xffffffff00000000;
      inPixels._data = (uint *)0x0;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,HALF,(char *)outPixels._data,2,0x27a,1,1,0.0,SUB81(in_R10,0),
                 (bool)((char)&inPixels + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&inPixels,"X",(Slice *)&out);
      std::operator<<((ostream *)&std::cout,"writing ");
      std::ostream::flush();
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::OutputFile::OutputFile(&out,_Var6._M_p,&hdr,iVar8);
      Imf_2_5::OutputFile::setFrameBuffer(&out,(FrameBuffer *)&inPixels);
      Imf_2_5::OutputFile::writePixels(&out,0x21b);
      Imf_2_5::OutputFile::~OutputFile(&out);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&inPixels);
      Imf_2_5::Header::~Header(&hdr);
      inPixels._sizeX = 0x21b;
      inPixels._sizeY = 0x13d;
      inPixels._data = (uint *)operator_new__(0x536de);
      std::operator<<((ostream *)&std::cout,"reading ");
      std::ostream::flush();
      out._data = (Data *)((ulong)out._data & 0xffffffff00000000);
      Imf_2_5::Slice::Slice
                ((Slice *)&hdr,HALF,(char *)inPixels._data,2,0x27a,1,1,0.0,SUB81(in_R10,0),
                 (bool)((char)&out + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"X",(Slice *)&hdr);
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::InputFile::InputFile((InputFile *)&hdr,_Var6._M_p,iVar8);
      Imf_2_5::InputFile::setFrameBuffer((InputFile *)&hdr,(FrameBuffer *)&out);
      Imf_2_5::InputFile::readPixels((InputFile *)&hdr,0,0x21a);
      Imf_2_5::InputFile::~InputFile((InputFile *)&hdr);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&out);
      std::operator<<((ostream *)&std::cout,"comparing");
      std::ostream::flush();
      puVar14 = inPixels._data;
      puVar19 = outPixels._data;
      for (lVar18 = 0; lVar18 != 0x21b; lVar18 = lVar18 + 1) {
        lVar20 = 0;
        while (lVar20 != 0x13d) {
          in_R10 = (ulong)*(ushort *)((long)puVar19 + lVar20 * 2);
          fVar4 = *(float *)((long)&half::_toFloat +
                            (ulong)*(ushort *)((long)puVar14 + lVar20 * 2) * 4);
          lVar20 = lVar20 + 1;
          pfVar3 = (float *)((long)&half::_toFloat + in_R10 * 4);
          if ((fVar4 != *pfVar3) || (NAN(fVar4) || NAN(*pfVar3))) {
            pcVar15 = 
            "void (anonymous namespace)::testScanLineImageChannel(const char *, int, int, Compression) [OutType = half, OutTypeTag = Imf_2_5::HALF, InType = half, InTypeTag = Imf_2_5::HALF]"
            ;
            goto LAB_00130ce1;
          }
        }
        puVar19 = (uint *)((long)puVar19 + outPixels._sizeY * 2);
        puVar14 = (uint *)((long)puVar14 + inPixels._sizeY * 2);
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      remove(_Var6._M_p);
      Imf_2_5::Array2D<half>::~Array2D((Array2D<half> *)&inPixels);
      Imf_2_5::Array2D<half>::~Array2D((Array2D<half> *)&outPixels);
      _Var6._M_p = local_58._M_dataplus._M_p;
      poVar10 = std::operator<<((ostream *)&std::cout,"tiles, compression ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,CVar21);
      poVar10 = std::operator<<(poVar10,", ");
      poVar10 = std::operator<<(poVar10,"output type ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,1);
      poVar10 = std::operator<<(poVar10,", ");
      poVar10 = std::operator<<(poVar10,"input type ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,1);
      std::operator<<(poVar10,":\n    ");
      std::ostream::flush();
      outPixels._sizeX = 0x21b;
      outPixels._sizeY = 0x13d;
      outPixels._data = (uint *)operator_new__(0x536de);
      lVar18 = 0;
      for (uVar13 = 0; uVar13 != 0x21b; uVar13 = uVar13 + 1) {
        uVar16 = uVar13 & 0xffffffff;
        for (lVar20 = 0; lVar20 != 0x27a; lVar20 = lVar20 + 2) {
          half::operator=((half *)((long)outPixels._data + lVar20 + outPixels._sizeY * lVar18),
                          (float)(int)uVar16);
          uVar16 = (ulong)((int)uVar16 + 10);
        }
        lVar18 = lVar18 + 2;
      }
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      Imf_2_5::Header::Header(&hdr,0x13d,0x21b,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x4300000043;
      out._data = (Data *)0x0;
      Imf_2_5::Header::setTileDescription(&hdr,(TileDescription *)&out);
      pCVar11 = Imf_2_5::Header::compression(&hdr);
      *pCVar11 = CVar21;
      pCVar12 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar12,"X",(Channel *)&out);
      inPixels._sizeY = inPixels._sizeY & 0xffffffff00000000;
      inPixels._data = (uint *)0x0;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,HALF,(char *)outPixels._data,2,0x27a,1,1,0.0,SUB81(in_R10,0),
                 (bool)((char)&inPixels + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&inPixels,"X",(Slice *)&out);
      std::operator<<((ostream *)&std::cout,"writing ");
      std::ostream::flush();
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&out,_Var6._M_p,&hdr,iVar8);
      Imf_2_5::TiledOutputFile::setFrameBuffer((TiledOutputFile *)&out,(FrameBuffer *)&inPixels);
      iVar8 = Imf_2_5::TiledOutputFile::numXTiles((TiledOutputFile *)&out,0);
      iVar9 = Imf_2_5::TiledOutputFile::numYTiles((TiledOutputFile *)&out,0);
      Imf_2_5::TiledOutputFile::writeTiles((TiledOutputFile *)&out,0,iVar8 + -1,0,iVar9 + -1,0);
      Imf_2_5::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&out);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&inPixels);
      Imf_2_5::Header::~Header(&hdr);
      inPixels._sizeX = 0x21b;
      inPixels._sizeY = 0x13d;
      inPixels._data = (uint *)operator_new__(0x536de);
      std::operator<<((ostream *)&std::cout,"reading ");
      std::ostream::flush();
      out._data = (Data *)((ulong)out._data & 0xffffffff00000000);
      Imf_2_5::Slice::Slice
                ((Slice *)&hdr,HALF,(char *)inPixels._data,2,0x27a,1,1,0.0,SUB81(in_R10,0),
                 (bool)((char)&out + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"X",(Slice *)&hdr);
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledInputFile::TiledInputFile((TiledInputFile *)&hdr,_Var6._M_p,iVar8);
      Imf_2_5::TiledInputFile::setFrameBuffer((TiledInputFile *)&hdr,(FrameBuffer *)&out);
      iVar8 = Imf_2_5::TiledInputFile::numXTiles((TiledInputFile *)&hdr,0);
      iVar9 = Imf_2_5::TiledInputFile::numYTiles((TiledInputFile *)&hdr,0);
      Imf_2_5::TiledInputFile::readTiles((TiledInputFile *)&hdr,0,iVar8 + -1,0,iVar9 + -1,0);
      Imf_2_5::TiledInputFile::~TiledInputFile((TiledInputFile *)&hdr);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&out);
      std::operator<<((ostream *)&std::cout,"comparing");
      std::ostream::flush();
      puVar14 = inPixels._data;
      puVar19 = outPixels._data;
      for (lVar18 = 0; lVar18 != 0x21b; lVar18 = lVar18 + 1) {
        lVar20 = 0;
        while (lVar20 != 0x13d) {
          in_R10 = (ulong)*(ushort *)((long)puVar19 + lVar20 * 2);
          fVar4 = *(float *)((long)&half::_toFloat +
                            (ulong)*(ushort *)((long)puVar14 + lVar20 * 2) * 4);
          lVar20 = lVar20 + 1;
          pfVar3 = (float *)((long)&half::_toFloat + in_R10 * 4);
          if ((fVar4 != *pfVar3) || (NAN(fVar4) || NAN(*pfVar3))) {
            pcVar15 = 
            "void (anonymous namespace)::testTiledImageChannel(const char *, int, int, Compression) [OutType = half, OutTypeTag = Imf_2_5::HALF, InType = half, InTypeTag = Imf_2_5::HALF]"
            ;
            goto LAB_00130d00;
          }
        }
        puVar19 = (uint *)((long)puVar19 + outPixels._sizeY * 2);
        puVar14 = (uint *)((long)puVar14 + inPixels._sizeY * 2);
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      remove(_Var6._M_p);
      Imf_2_5::Array2D<half>::~Array2D((Array2D<half> *)&inPixels);
      Imf_2_5::Array2D<half>::~Array2D((Array2D<half> *)&outPixels);
      std::__cxx11::string::~string((string *)&local_58);
      std::operator+(&local_58,tempDir,"imf_test_conv.exr");
      _Var6._M_p = local_58._M_dataplus._M_p;
      poVar10 = std::operator<<((ostream *)&std::cout,"scan lines, compression ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,CVar21);
      poVar10 = std::operator<<(poVar10,", ");
      poVar10 = std::operator<<(poVar10,"output type ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,1);
      poVar10 = std::operator<<(poVar10,", ");
      poVar10 = std::operator<<(poVar10,"input type ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,2);
      std::operator<<(poVar10,":\n    ");
      std::ostream::flush();
      outPixels._sizeX = 0x21b;
      outPixels._sizeY = 0x13d;
      outPixels._data = (uint *)operator_new__(0x536de);
      lVar18 = 0;
      for (uVar13 = 0; uVar13 != 0x21b; uVar13 = uVar13 + 1) {
        uVar16 = uVar13 & 0xffffffff;
        for (lVar20 = 0; lVar20 != 0x27a; lVar20 = lVar20 + 2) {
          half::operator=((half *)((long)outPixels._data + lVar20 + outPixels._sizeY * lVar18),
                          (float)(int)uVar16);
          uVar16 = (ulong)((int)uVar16 + 10);
        }
        lVar18 = lVar18 + 2;
      }
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      Imf_2_5::Header::Header(&hdr,0x13d,0x21b,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar11 = Imf_2_5::Header::compression(&hdr);
      *pCVar11 = CVar21;
      pCVar12 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar12,"X",(Channel *)&out);
      inPixels._sizeY = inPixels._sizeY & 0xffffffff00000000;
      inPixels._data = (uint *)0x0;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,HALF,(char *)outPixels._data,2,0x27a,1,1,0.0,SUB81(in_R10,0),
                 (bool)((char)&inPixels + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&inPixels,"X",(Slice *)&out);
      std::operator<<((ostream *)&std::cout,"writing ");
      std::ostream::flush();
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::OutputFile::OutputFile(&out,_Var6._M_p,&hdr,iVar8);
      Imf_2_5::OutputFile::setFrameBuffer(&out,(FrameBuffer *)&inPixels);
      Imf_2_5::OutputFile::writePixels(&out,0x21b);
      Imf_2_5::OutputFile::~OutputFile(&out);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&inPixels);
      Imf_2_5::Header::~Header(&hdr);
      inPixels._sizeX = 0x21b;
      inPixels._sizeY = 0x13d;
      inPixels._data = (uint *)operator_new__(0xa6dbc);
      std::operator<<((ostream *)&std::cout,"reading ");
      std::ostream::flush();
      out._data = (Data *)((ulong)out._data & 0xffffffff00000000);
      Imf_2_5::Slice::Slice
                ((Slice *)&hdr,FLOAT,(char *)inPixels._data,4,0x4f4,1,1,0.0,SUB81(in_R10,0),
                 (bool)((char)&out + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"X",(Slice *)&hdr);
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::InputFile::InputFile((InputFile *)&hdr,_Var6._M_p,iVar8);
      Imf_2_5::InputFile::setFrameBuffer((InputFile *)&hdr,(FrameBuffer *)&out);
      Imf_2_5::InputFile::readPixels((InputFile *)&hdr,0,0x21a);
      Imf_2_5::InputFile::~InputFile((InputFile *)&hdr);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&out);
      std::operator<<((ostream *)&std::cout,"comparing");
      std::ostream::flush();
      lVar18 = 0;
      lVar20 = 0;
      for (lVar23 = 0; lVar23 != 0x21b; lVar23 = lVar23 + 1) {
        lVar17 = 0;
        while (lVar17 != 0x13d) {
          bVar7 = equivalent(*(float *)((long)inPixels._data + lVar17 * 4 + inPixels._sizeY * lVar18
                                       ),
                             *(float *)((long)&half::_toFloat +
                                       (ulong)*(ushort *)
                                               ((long)outPixels._data +
                                               lVar17 * 2 + outPixels._sizeY * lVar20) * 4),CVar21);
          lVar17 = lVar17 + 1;
          if (!bVar7) {
            pcVar15 = 
            "void (anonymous namespace)::testScanLineImageChannel(const char *, int, int, Compression) [OutType = half, OutTypeTag = Imf_2_5::HALF, InType = float, InTypeTag = Imf_2_5::FLOAT]"
            ;
            goto LAB_00130ce1;
          }
        }
        lVar20 = lVar20 + 2;
        lVar18 = lVar18 + 4;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      remove(_Var6._M_p);
      Imf_2_5::Array2D<float>::~Array2D((Array2D<float> *)&inPixels);
      Imf_2_5::Array2D<half>::~Array2D((Array2D<half> *)&outPixels);
      _Var6._M_p = local_58._M_dataplus._M_p;
      poVar10 = std::operator<<((ostream *)&std::cout,"tiles, compression ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,CVar21);
      poVar10 = std::operator<<(poVar10,", ");
      poVar10 = std::operator<<(poVar10,"output type ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,1);
      poVar10 = std::operator<<(poVar10,", ");
      poVar10 = std::operator<<(poVar10,"input type ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,2);
      std::operator<<(poVar10,":\n    ");
      std::ostream::flush();
      outPixels._sizeX = 0x21b;
      outPixels._sizeY = 0x13d;
      outPixels._data = (uint *)operator_new__(0x536de);
      lVar18 = 0;
      for (uVar13 = 0; uVar13 != 0x21b; uVar13 = uVar13 + 1) {
        uVar16 = uVar13 & 0xffffffff;
        for (lVar20 = 0; lVar20 != 0x27a; lVar20 = lVar20 + 2) {
          half::operator=((half *)((long)outPixels._data + lVar20 + outPixels._sizeY * lVar18),
                          (float)(int)uVar16);
          uVar16 = (ulong)((int)uVar16 + 10);
        }
        lVar18 = lVar18 + 2;
      }
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      Imf_2_5::Header::Header(&hdr,0x13d,0x21b,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x4300000043;
      out._data = (Data *)0x0;
      Imf_2_5::Header::setTileDescription(&hdr,(TileDescription *)&out);
      pCVar11 = Imf_2_5::Header::compression(&hdr);
      *pCVar11 = CVar21;
      pCVar12 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar12,"X",(Channel *)&out);
      inPixels._sizeY = inPixels._sizeY & 0xffffffff00000000;
      inPixels._data = (uint *)0x0;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,HALF,(char *)outPixels._data,2,0x27a,1,1,0.0,SUB81(in_R10,0),
                 (bool)((char)&inPixels + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&inPixels,"X",(Slice *)&out);
      std::operator<<((ostream *)&std::cout,"writing ");
      std::ostream::flush();
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&out,_Var6._M_p,&hdr,iVar8);
      Imf_2_5::TiledOutputFile::setFrameBuffer((TiledOutputFile *)&out,(FrameBuffer *)&inPixels);
      iVar8 = Imf_2_5::TiledOutputFile::numXTiles((TiledOutputFile *)&out,0);
      iVar9 = Imf_2_5::TiledOutputFile::numYTiles((TiledOutputFile *)&out,0);
      Imf_2_5::TiledOutputFile::writeTiles((TiledOutputFile *)&out,0,iVar8 + -1,0,iVar9 + -1,0);
      Imf_2_5::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&out);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&inPixels);
      Imf_2_5::Header::~Header(&hdr);
      inPixels._sizeX = 0x21b;
      inPixels._sizeY = 0x13d;
      inPixels._data = (uint *)operator_new__(0xa6dbc);
      std::operator<<((ostream *)&std::cout,"reading ");
      std::ostream::flush();
      out._data = (Data *)((ulong)out._data & 0xffffffff00000000);
      Imf_2_5::Slice::Slice
                ((Slice *)&hdr,FLOAT,(char *)inPixels._data,4,0x4f4,1,1,0.0,SUB81(in_R10,0),
                 (bool)((char)&out + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"X",(Slice *)&hdr);
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledInputFile::TiledInputFile((TiledInputFile *)&hdr,_Var6._M_p,iVar8);
      Imf_2_5::TiledInputFile::setFrameBuffer((TiledInputFile *)&hdr,(FrameBuffer *)&out);
      iVar8 = Imf_2_5::TiledInputFile::numXTiles((TiledInputFile *)&hdr,0);
      iVar9 = Imf_2_5::TiledInputFile::numYTiles((TiledInputFile *)&hdr,0);
      Imf_2_5::TiledInputFile::readTiles((TiledInputFile *)&hdr,0,iVar8 + -1,0,iVar9 + -1,0);
      Imf_2_5::TiledInputFile::~TiledInputFile((TiledInputFile *)&hdr);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&out);
      std::operator<<((ostream *)&std::cout,"comparing");
      std::ostream::flush();
      lVar18 = 0;
      lVar20 = 0;
      for (lVar23 = 0; lVar23 != 0x21b; lVar23 = lVar23 + 1) {
        lVar17 = 0;
        while (lVar17 != 0x13d) {
          bVar7 = equivalent(*(float *)((long)inPixels._data + lVar17 * 4 + inPixels._sizeY * lVar18
                                       ),
                             *(float *)((long)&half::_toFloat +
                                       (ulong)*(ushort *)
                                               ((long)outPixels._data +
                                               lVar17 * 2 + outPixels._sizeY * lVar20) * 4),CVar21);
          lVar17 = lVar17 + 1;
          if (!bVar7) {
            pcVar15 = 
            "void (anonymous namespace)::testTiledImageChannel(const char *, int, int, Compression) [OutType = half, OutTypeTag = Imf_2_5::HALF, InType = float, InTypeTag = Imf_2_5::FLOAT]"
            ;
            goto LAB_00130d00;
          }
        }
        lVar20 = lVar20 + 2;
        lVar18 = lVar18 + 4;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      remove(_Var6._M_p);
      Imf_2_5::Array2D<float>::~Array2D((Array2D<float> *)&inPixels);
      Imf_2_5::Array2D<half>::~Array2D((Array2D<half> *)&outPixels);
      std::__cxx11::string::~string((string *)&local_58);
      std::operator+(&local_58,tempDir,"imf_test_conv.exr");
      _Var6._M_p = local_58._M_dataplus._M_p;
      poVar10 = std::operator<<((ostream *)&std::cout,"scan lines, compression ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,CVar21);
      poVar10 = std::operator<<(poVar10,", ");
      poVar10 = std::operator<<(poVar10,"output type ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,2);
      poVar10 = std::operator<<(poVar10,", ");
      poVar10 = std::operator<<(poVar10,"input type ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,0);
      std::operator<<(poVar10,":\n    ");
      std::ostream::flush();
      outPixels._sizeX = 0x21b;
      outPixels._sizeY = 0x13d;
      outPixels._data = (uint *)operator_new__(0xa6dbc);
      puVar14 = outPixels._data;
      for (uVar13 = 0; uVar13 != 0x21b; uVar13 = uVar13 + 1) {
        uVar16 = uVar13 & 0xffffffff;
        for (lVar18 = 0; lVar18 != 0x13d; lVar18 = lVar18 + 1) {
          puVar14[lVar18] = (uint)(float)(int)uVar16;
          uVar16 = (ulong)((int)uVar16 + 10);
        }
        puVar14 = puVar14 + 0x13d;
      }
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      Imf_2_5::Header::Header(&hdr,0x13d,0x21b,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar11 = Imf_2_5::Header::compression(&hdr);
      *pCVar11 = CVar21;
      pCVar12 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,FLOAT,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar12,"X",(Channel *)&out);
      inPixels._sizeY = inPixels._sizeY & 0xffffffff00000000;
      inPixels._data = (uint *)0x0;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,FLOAT,(char *)outPixels._data,4,0x4f4,1,1,0.0,SUB81(in_R10,0),
                 (bool)((char)&inPixels + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&inPixels,"X",(Slice *)&out);
      std::operator<<((ostream *)&std::cout,"writing ");
      std::ostream::flush();
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::OutputFile::OutputFile(&out,_Var6._M_p,&hdr,iVar8);
      Imf_2_5::OutputFile::setFrameBuffer(&out,(FrameBuffer *)&inPixels);
      Imf_2_5::OutputFile::writePixels(&out,0x21b);
      Imf_2_5::OutputFile::~OutputFile(&out);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&inPixels);
      Imf_2_5::Header::~Header(&hdr);
      inPixels._sizeX = 0x21b;
      inPixels._sizeY = 0x13d;
      inPixels._data = (uint *)operator_new__(0xa6dbc);
      std::operator<<((ostream *)&std::cout,"reading ");
      std::ostream::flush();
      out._data = (Data *)((ulong)out._data & 0xffffffff00000000);
      Imf_2_5::Slice::Slice
                ((Slice *)&hdr,UINT,(char *)inPixels._data,4,0x4f4,1,1,0.0,SUB81(in_R10,0),
                 (bool)((char)&out + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"X",(Slice *)&hdr);
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::InputFile::InputFile((InputFile *)&hdr,_Var6._M_p,iVar8);
      Imf_2_5::InputFile::setFrameBuffer((InputFile *)&hdr,(FrameBuffer *)&out);
      Imf_2_5::InputFile::readPixels((InputFile *)&hdr,0,0x21a);
      Imf_2_5::InputFile::~InputFile((InputFile *)&hdr);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&out);
      std::operator<<((ostream *)&std::cout,"comparing");
      std::ostream::flush();
      puVar14 = inPixels._data;
      puVar19 = outPixels._data;
      for (lVar18 = 0; lVar18 != 0x21b; lVar18 = lVar18 + 1) {
        uVar13 = 0;
        while (uVar13 != 0x13d) {
          pfVar3 = (float *)(puVar19 + uVar13);
          in_R10 = uVar13 + 1;
          puVar1 = puVar14 + uVar13;
          uVar13 = in_R10;
          if (*puVar1 != (uint)(long)*pfVar3) {
            pcVar15 = 
            "void (anonymous namespace)::testScanLineImageChannel(const char *, int, int, Compression) [OutType = float, OutTypeTag = Imf_2_5::FLOAT, InType = unsigned int, InTypeTag = Imf_2_5::UINT]"
            ;
            goto LAB_00130ce1;
          }
        }
        puVar19 = puVar19 + outPixels._sizeY;
        puVar14 = puVar14 + inPixels._sizeY;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      remove(_Var6._M_p);
      Imf_2_5::Array2D<unsigned_int>::~Array2D(&inPixels);
      Imf_2_5::Array2D<float>::~Array2D((Array2D<float> *)&outPixels);
      _Var6._M_p = local_58._M_dataplus._M_p;
      poVar10 = std::operator<<((ostream *)&std::cout,"tiles, compression ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,CVar21);
      poVar10 = std::operator<<(poVar10,", ");
      poVar10 = std::operator<<(poVar10,"output type ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,2);
      poVar10 = std::operator<<(poVar10,", ");
      poVar10 = std::operator<<(poVar10,"input type ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,0);
      std::operator<<(poVar10,":\n    ");
      std::ostream::flush();
      outPixels._sizeX = 0x21b;
      outPixels._sizeY = 0x13d;
      outPixels._data = (uint *)operator_new__(0xa6dbc);
      puVar14 = outPixels._data;
      for (uVar13 = 0; uVar13 != 0x21b; uVar13 = uVar13 + 1) {
        uVar16 = uVar13 & 0xffffffff;
        for (lVar18 = 0; lVar18 != 0x13d; lVar18 = lVar18 + 1) {
          puVar14[lVar18] = (uint)(float)(int)uVar16;
          uVar16 = (ulong)((int)uVar16 + 10);
        }
        puVar14 = puVar14 + 0x13d;
      }
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      Imf_2_5::Header::Header(&hdr,0x13d,0x21b,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x4300000043;
      out._data = (Data *)0x0;
      Imf_2_5::Header::setTileDescription(&hdr,(TileDescription *)&out);
      pCVar11 = Imf_2_5::Header::compression(&hdr);
      *pCVar11 = CVar21;
      pCVar12 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,FLOAT,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar12,"X",(Channel *)&out);
      inPixels._sizeY = inPixels._sizeY & 0xffffffff00000000;
      inPixels._data = (uint *)0x0;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,FLOAT,(char *)outPixels._data,4,0x4f4,1,1,0.0,SUB81(in_R10,0),
                 (bool)((char)&inPixels + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&inPixels,"X",(Slice *)&out);
      std::operator<<((ostream *)&std::cout,"writing ");
      std::ostream::flush();
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&out,_Var6._M_p,&hdr,iVar8);
      Imf_2_5::TiledOutputFile::setFrameBuffer((TiledOutputFile *)&out,(FrameBuffer *)&inPixels);
      iVar8 = Imf_2_5::TiledOutputFile::numXTiles((TiledOutputFile *)&out,0);
      iVar9 = Imf_2_5::TiledOutputFile::numYTiles((TiledOutputFile *)&out,0);
      Imf_2_5::TiledOutputFile::writeTiles((TiledOutputFile *)&out,0,iVar8 + -1,0,iVar9 + -1,0);
      Imf_2_5::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&out);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&inPixels);
      Imf_2_5::Header::~Header(&hdr);
      inPixels._sizeX = 0x21b;
      inPixels._sizeY = 0x13d;
      inPixels._data = (uint *)operator_new__(0xa6dbc);
      std::operator<<((ostream *)&std::cout,"reading ");
      std::ostream::flush();
      out._data = (Data *)((ulong)out._data & 0xffffffff00000000);
      Imf_2_5::Slice::Slice
                ((Slice *)&hdr,UINT,(char *)inPixels._data,4,0x4f4,1,1,0.0,SUB81(in_R10,0),
                 (bool)((char)&out + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"X",(Slice *)&hdr);
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledInputFile::TiledInputFile((TiledInputFile *)&hdr,_Var6._M_p,iVar8);
      Imf_2_5::TiledInputFile::setFrameBuffer((TiledInputFile *)&hdr,(FrameBuffer *)&out);
      iVar8 = Imf_2_5::TiledInputFile::numXTiles((TiledInputFile *)&hdr,0);
      iVar9 = Imf_2_5::TiledInputFile::numYTiles((TiledInputFile *)&hdr,0);
      Imf_2_5::TiledInputFile::readTiles((TiledInputFile *)&hdr,0,iVar8 + -1,0,iVar9 + -1,0);
      Imf_2_5::TiledInputFile::~TiledInputFile((TiledInputFile *)&hdr);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&out);
      std::operator<<((ostream *)&std::cout,"comparing");
      std::ostream::flush();
      puVar14 = inPixels._data;
      puVar19 = outPixels._data;
      for (lVar18 = 0; lVar18 != 0x21b; lVar18 = lVar18 + 1) {
        uVar13 = 0;
        while (uVar13 != 0x13d) {
          pfVar3 = (float *)(puVar19 + uVar13);
          in_R10 = uVar13 + 1;
          puVar1 = puVar14 + uVar13;
          uVar13 = in_R10;
          if (*puVar1 != (uint)(long)*pfVar3) {
            pcVar15 = 
            "void (anonymous namespace)::testTiledImageChannel(const char *, int, int, Compression) [OutType = float, OutTypeTag = Imf_2_5::FLOAT, InType = unsigned int, InTypeTag = Imf_2_5::UINT]"
            ;
            goto LAB_00130d00;
          }
        }
        puVar19 = puVar19 + outPixels._sizeY;
        puVar14 = puVar14 + inPixels._sizeY;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      remove(_Var6._M_p);
      Imf_2_5::Array2D<unsigned_int>::~Array2D(&inPixels);
      Imf_2_5::Array2D<float>::~Array2D((Array2D<float> *)&outPixels);
      std::__cxx11::string::~string((string *)&local_58);
      std::operator+(&local_58,tempDir,"imf_test_conv.exr");
      _Var6._M_p = local_58._M_dataplus._M_p;
      poVar10 = std::operator<<((ostream *)&std::cout,"scan lines, compression ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,CVar21);
      poVar10 = std::operator<<(poVar10,", ");
      poVar10 = std::operator<<(poVar10,"output type ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,2);
      poVar10 = std::operator<<(poVar10,", ");
      poVar10 = std::operator<<(poVar10,"input type ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,1);
      std::operator<<(poVar10,":\n    ");
      std::ostream::flush();
      outPixels._sizeX = 0x21b;
      outPixels._sizeY = 0x13d;
      outPixels._data = (uint *)operator_new__(0xa6dbc);
      puVar14 = outPixels._data;
      for (uVar13 = 0; uVar13 != 0x21b; uVar13 = uVar13 + 1) {
        uVar16 = uVar13 & 0xffffffff;
        for (lVar18 = 0; lVar18 != 0x13d; lVar18 = lVar18 + 1) {
          puVar14[lVar18] = (uint)(float)(int)uVar16;
          uVar16 = (ulong)((int)uVar16 + 10);
        }
        puVar14 = puVar14 + 0x13d;
      }
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      Imf_2_5::Header::Header(&hdr,0x13d,0x21b,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar11 = Imf_2_5::Header::compression(&hdr);
      *pCVar11 = CVar21;
      pCVar12 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,FLOAT,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar12,"X",(Channel *)&out);
      inPixels._sizeY = inPixels._sizeY & 0xffffffff00000000;
      inPixels._data = (uint *)0x0;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,FLOAT,(char *)outPixels._data,4,0x4f4,1,1,0.0,SUB81(in_R10,0),
                 (bool)((char)&inPixels + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&inPixels,"X",(Slice *)&out);
      std::operator<<((ostream *)&std::cout,"writing ");
      std::ostream::flush();
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::OutputFile::OutputFile(&out,_Var6._M_p,&hdr,iVar8);
      Imf_2_5::OutputFile::setFrameBuffer(&out,(FrameBuffer *)&inPixels);
      Imf_2_5::OutputFile::writePixels(&out,0x21b);
      Imf_2_5::OutputFile::~OutputFile(&out);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&inPixels);
      Imf_2_5::Header::~Header(&hdr);
      inPixels._sizeX = 0x21b;
      inPixels._sizeY = 0x13d;
      inPixels._data = (uint *)operator_new__(0x536de);
      std::operator<<((ostream *)&std::cout,"reading ");
      std::ostream::flush();
      out._data = (Data *)((ulong)out._data & 0xffffffff00000000);
      Imf_2_5::Slice::Slice
                ((Slice *)&hdr,HALF,(char *)inPixels._data,2,0x27a,1,1,0.0,SUB81(in_R10,0),
                 (bool)((char)&out + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"X",(Slice *)&hdr);
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::InputFile::InputFile((InputFile *)&hdr,_Var6._M_p,iVar8);
      Imf_2_5::InputFile::setFrameBuffer((InputFile *)&hdr,(FrameBuffer *)&out);
      Imf_2_5::InputFile::readPixels((InputFile *)&hdr,0,0x21a);
      Imf_2_5::InputFile::~InputFile((InputFile *)&hdr);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&out);
      std::operator<<((ostream *)&std::cout,"comparing");
      std::ostream::flush();
      lVar18 = 0;
      lVar20 = 0;
      for (lVar23 = 0; lVar23 != 0x21b; lVar23 = lVar23 + 1) {
        lVar17 = 0;
        while (lVar17 != 0x13d) {
          uVar5 = *(ushort *)((long)inPixels._data + lVar17 * 2 + inPixels._sizeY * lVar18);
          half::half((half *)&hdr,
                     *(float *)((long)outPixels._data + lVar17 * 4 + outPixels._sizeY * lVar20));
          fVar4 = *(float *)((long)&half::_toFloat + (ulong)uVar5 * 4);
          lVar17 = lVar17 + 1;
          pfVar3 = (float *)((long)&half::_toFloat + (ulong)(ushort)hdr._map._M_t._M_impl._0_2_ * 4)
          ;
          if ((fVar4 != *pfVar3) || (uVar22 = local_38, NAN(fVar4) || NAN(*pfVar3))) {
            pcVar15 = 
            "void (anonymous namespace)::testScanLineImageChannel(const char *, int, int, Compression) [OutType = float, OutTypeTag = Imf_2_5::FLOAT, InType = half, InTypeTag = Imf_2_5::HALF]"
            ;
            goto LAB_00130ce1;
          }
        }
        lVar20 = lVar20 + 4;
        lVar18 = lVar18 + 2;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      remove(_Var6._M_p);
      Imf_2_5::Array2D<half>::~Array2D((Array2D<half> *)&inPixels);
      Imf_2_5::Array2D<float>::~Array2D((Array2D<float> *)&outPixels);
      _Var6._M_p = local_58._M_dataplus._M_p;
      poVar10 = std::operator<<((ostream *)&std::cout,"tiles, compression ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,(Compression)uVar22);
      poVar10 = std::operator<<(poVar10,", ");
      poVar10 = std::operator<<(poVar10,"output type ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,2);
      poVar10 = std::operator<<(poVar10,", ");
      poVar10 = std::operator<<(poVar10,"input type ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,1);
      std::operator<<(poVar10,":\n    ");
      std::ostream::flush();
      outPixels._sizeX = 0x21b;
      outPixels._sizeY = 0x13d;
      outPixels._data = (uint *)operator_new__(0xa6dbc);
      puVar14 = outPixels._data;
      for (uVar13 = 0; uVar13 != 0x21b; uVar13 = uVar13 + 1) {
        uVar16 = uVar13 & 0xffffffff;
        for (lVar18 = 0; lVar18 != 0x13d; lVar18 = lVar18 + 1) {
          puVar14[lVar18] = (uint)(float)(int)uVar16;
          uVar16 = (ulong)((int)uVar16 + 10);
        }
        puVar14 = puVar14 + 0x13d;
      }
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      Imf_2_5::Header::Header(&hdr,0x13d,0x21b,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x4300000043;
      out._data = (Data *)0x0;
      Imf_2_5::Header::setTileDescription(&hdr,(TileDescription *)&out);
      pCVar11 = Imf_2_5::Header::compression(&hdr);
      *pCVar11 = (Compression)uVar22;
      pCVar12 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,FLOAT,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar12,"X",(Channel *)&out);
      inPixels._sizeY = inPixels._sizeY & 0xffffffff00000000;
      inPixels._data = (uint *)0x0;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,FLOAT,(char *)outPixels._data,4,0x4f4,1,1,0.0,SUB81(in_R10,0),
                 (bool)((char)&inPixels + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&inPixels,"X",(Slice *)&out);
      std::operator<<((ostream *)&std::cout,"writing ");
      std::ostream::flush();
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&out,_Var6._M_p,&hdr,iVar8);
      Imf_2_5::TiledOutputFile::setFrameBuffer((TiledOutputFile *)&out,(FrameBuffer *)&inPixels);
      iVar8 = Imf_2_5::TiledOutputFile::numXTiles((TiledOutputFile *)&out,0);
      iVar9 = Imf_2_5::TiledOutputFile::numYTiles((TiledOutputFile *)&out,0);
      Imf_2_5::TiledOutputFile::writeTiles((TiledOutputFile *)&out,0,iVar8 + -1,0,iVar9 + -1,0);
      Imf_2_5::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&out);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&inPixels);
      Imf_2_5::Header::~Header(&hdr);
      inPixels._sizeX = 0x21b;
      inPixels._sizeY = 0x13d;
      inPixels._data = (uint *)operator_new__(0x536de);
      std::operator<<((ostream *)&std::cout,"reading ");
      std::ostream::flush();
      out._data = (Data *)((ulong)out._data & 0xffffffff00000000);
      Imf_2_5::Slice::Slice
                ((Slice *)&hdr,HALF,(char *)inPixels._data,2,0x27a,1,1,0.0,SUB81(in_R10,0),
                 (bool)((char)&out + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"X",(Slice *)&hdr);
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledInputFile::TiledInputFile((TiledInputFile *)&hdr,_Var6._M_p,iVar8);
      Imf_2_5::TiledInputFile::setFrameBuffer((TiledInputFile *)&hdr,(FrameBuffer *)&out);
      iVar8 = Imf_2_5::TiledInputFile::numXTiles((TiledInputFile *)&hdr,0);
      iVar9 = Imf_2_5::TiledInputFile::numYTiles((TiledInputFile *)&hdr,0);
      Imf_2_5::TiledInputFile::readTiles((TiledInputFile *)&hdr,0,iVar8 + -1,0,iVar9 + -1,0);
      Imf_2_5::TiledInputFile::~TiledInputFile((TiledInputFile *)&hdr);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&out);
      std::operator<<((ostream *)&std::cout,"comparing");
      std::ostream::flush();
      lVar18 = 0;
      lVar20 = 0;
      for (lVar23 = 0; lVar23 != 0x21b; lVar23 = lVar23 + 1) {
        lVar17 = 0;
        while (lVar17 != 0x13d) {
          uVar5 = *(ushort *)((long)inPixels._data + lVar17 * 2 + inPixels._sizeY * lVar18);
          half::half((half *)&hdr,
                     *(float *)((long)outPixels._data + lVar17 * 4 + outPixels._sizeY * lVar20));
          fVar4 = *(float *)((long)&half::_toFloat + (ulong)uVar5 * 4);
          lVar17 = lVar17 + 1;
          pfVar3 = (float *)((long)&half::_toFloat + (ulong)(ushort)hdr._map._M_t._M_impl._0_2_ * 4)
          ;
          if ((fVar4 != *pfVar3) || (uVar22 = local_38, NAN(fVar4) || NAN(*pfVar3))) {
            pcVar15 = 
            "void (anonymous namespace)::testTiledImageChannel(const char *, int, int, Compression) [OutType = float, OutTypeTag = Imf_2_5::FLOAT, InType = half, InTypeTag = Imf_2_5::HALF]"
            ;
            goto LAB_00130d00;
          }
        }
        lVar20 = lVar20 + 4;
        lVar18 = lVar18 + 2;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      remove(_Var6._M_p);
      Imf_2_5::Array2D<half>::~Array2D((Array2D<half> *)&inPixels);
      Imf_2_5::Array2D<float>::~Array2D((Array2D<float> *)&outPixels);
      std::__cxx11::string::~string((string *)&local_58);
      std::operator+(&local_58,tempDir,"imf_test_conv.exr");
      _Var6._M_p = local_58._M_dataplus._M_p;
      poVar10 = std::operator<<((ostream *)&std::cout,"scan lines, compression ");
      CVar21 = (Compression)uVar22;
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,CVar21);
      poVar10 = std::operator<<(poVar10,", ");
      poVar10 = std::operator<<(poVar10,"output type ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,2);
      poVar10 = std::operator<<(poVar10,", ");
      poVar10 = std::operator<<(poVar10,"input type ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,2);
      std::operator<<(poVar10,":\n    ");
      std::ostream::flush();
      outPixels._sizeX = 0x21b;
      outPixels._sizeY = 0x13d;
      outPixels._data = (uint *)operator_new__(0xa6dbc);
      puVar14 = outPixels._data;
      for (uVar13 = 0; uVar13 != 0x21b; uVar13 = uVar13 + 1) {
        uVar16 = uVar13 & 0xffffffff;
        for (lVar18 = 0; lVar18 != 0x13d; lVar18 = lVar18 + 1) {
          puVar14[lVar18] = (uint)(float)(int)uVar16;
          uVar16 = (ulong)((int)uVar16 + 10);
        }
        puVar14 = puVar14 + 0x13d;
      }
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      Imf_2_5::Header::Header(&hdr,0x13d,0x21b,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar11 = Imf_2_5::Header::compression(&hdr);
      *pCVar11 = CVar21;
      pCVar12 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,FLOAT,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar12,"X",(Channel *)&out);
      inPixels._sizeY = inPixels._sizeY & 0xffffffff00000000;
      inPixels._data = (uint *)0x0;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,FLOAT,(char *)outPixels._data,4,0x4f4,1,1,0.0,SUB81(in_R10,0),
                 (bool)((char)&inPixels + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&inPixels,"X",(Slice *)&out);
      std::operator<<((ostream *)&std::cout,"writing ");
      std::ostream::flush();
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::OutputFile::OutputFile(&out,_Var6._M_p,&hdr,iVar8);
      Imf_2_5::OutputFile::setFrameBuffer(&out,(FrameBuffer *)&inPixels);
      Imf_2_5::OutputFile::writePixels(&out,0x21b);
      Imf_2_5::OutputFile::~OutputFile(&out);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&inPixels);
      Imf_2_5::Header::~Header(&hdr);
      inPixels._sizeX = 0x21b;
      inPixels._sizeY = 0x13d;
      inPixels._data = (uint *)operator_new__(0xa6dbc);
      std::operator<<((ostream *)&std::cout,"reading ");
      std::ostream::flush();
      out._data = (Data *)((ulong)out._data & 0xffffffff00000000);
      Imf_2_5::Slice::Slice
                ((Slice *)&hdr,FLOAT,(char *)inPixels._data,4,0x4f4,1,1,0.0,SUB81(in_R10,0),
                 (bool)((char)&out + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"X",(Slice *)&hdr);
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::InputFile::InputFile((InputFile *)&hdr,_Var6._M_p,iVar8);
      Imf_2_5::InputFile::setFrameBuffer((InputFile *)&hdr,(FrameBuffer *)&out);
      Imf_2_5::InputFile::readPixels((InputFile *)&hdr,0,0x21a);
      Imf_2_5::InputFile::~InputFile((InputFile *)&hdr);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&out);
      std::operator<<((ostream *)&std::cout,"comparing");
      std::ostream::flush();
      lVar18 = 0;
      for (lVar20 = 0; lVar20 != 0x21b; lVar20 = lVar20 + 1) {
        lVar23 = 0;
        while (lVar23 != 0x13d) {
          bVar7 = equivalent(*(float *)((long)inPixels._data + lVar23 * 4 + inPixels._sizeY * lVar18
                                       ),
                             *(float *)((long)outPixels._data +
                                       lVar23 * 4 + outPixels._sizeY * lVar18),CVar21);
          lVar23 = lVar23 + 1;
          if (!bVar7) {
            pcVar15 = 
            "void (anonymous namespace)::testScanLineImageChannel(const char *, int, int, Compression) [OutType = float, OutTypeTag = Imf_2_5::FLOAT, InType = float, InTypeTag = Imf_2_5::FLOAT]"
            ;
LAB_00130ce1:
            __assert_fail("isEquivalent (inPixels[y][x], InType (outPixels[y][x]), compression)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testConversion.cpp"
                          ,0xea,pcVar15);
          }
        }
        lVar18 = lVar18 + 4;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      remove(_Var6._M_p);
      Imf_2_5::Array2D<float>::~Array2D((Array2D<float> *)&inPixels);
      Imf_2_5::Array2D<float>::~Array2D((Array2D<float> *)&outPixels);
      _Var6._M_p = local_58._M_dataplus._M_p;
      poVar10 = std::operator<<((ostream *)&std::cout,"tiles, compression ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,CVar21);
      poVar10 = std::operator<<(poVar10,", ");
      poVar10 = std::operator<<(poVar10,"output type ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,2);
      poVar10 = std::operator<<(poVar10,", ");
      poVar10 = std::operator<<(poVar10,"input type ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,2);
      std::operator<<(poVar10,":\n    ");
      std::ostream::flush();
      outPixels._sizeX = 0x21b;
      outPixels._sizeY = 0x13d;
      outPixels._data = (uint *)operator_new__(0xa6dbc);
      puVar14 = outPixels._data;
      for (uVar13 = 0; uVar13 != 0x21b; uVar13 = uVar13 + 1) {
        uVar16 = uVar13 & 0xffffffff;
        for (lVar18 = 0; lVar18 != 0x13d; lVar18 = lVar18 + 1) {
          puVar14[lVar18] = (uint)(float)(int)uVar16;
          uVar16 = (ulong)((int)uVar16 + 10);
        }
        puVar14 = puVar14 + 0x13d;
      }
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
      Imf_2_5::Header::Header(&hdr,0x13d,0x21b,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x4300000043;
      out._data = (Data *)0x0;
      Imf_2_5::Header::setTileDescription(&hdr,(TileDescription *)&out);
      pCVar11 = Imf_2_5::Header::compression(&hdr);
      *pCVar11 = CVar21;
      pCVar12 = Imf_2_5::Header::channels(&hdr);
      Imf_2_5::Channel::Channel((Channel *)&out,FLOAT,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar12,"X",(Channel *)&out);
      inPixels._sizeY = inPixels._sizeY & 0xffffffff00000000;
      inPixels._data = (uint *)0x0;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,FLOAT,(char *)outPixels._data,4,0x4f4,1,1,0.0,SUB81(in_R10,0),
                 (bool)((char)&inPixels + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&inPixels,"X",(Slice *)&out);
      std::operator<<((ostream *)&std::cout,"writing ");
      std::ostream::flush();
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&out,_Var6._M_p,&hdr,iVar8);
      Imf_2_5::TiledOutputFile::setFrameBuffer((TiledOutputFile *)&out,(FrameBuffer *)&inPixels);
      iVar8 = Imf_2_5::TiledOutputFile::numXTiles((TiledOutputFile *)&out,0);
      iVar9 = Imf_2_5::TiledOutputFile::numYTiles((TiledOutputFile *)&out,0);
      Imf_2_5::TiledOutputFile::writeTiles((TiledOutputFile *)&out,0,iVar8 + -1,0,iVar9 + -1,0);
      Imf_2_5::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&out);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&inPixels);
      Imf_2_5::Header::~Header(&hdr);
      inPixels._sizeX = 0x21b;
      inPixels._sizeY = 0x13d;
      inPixels._data = (uint *)operator_new__(0xa6dbc);
      std::operator<<((ostream *)&std::cout,"reading ");
      std::ostream::flush();
      out._data = (Data *)((ulong)out._data & 0xffffffff00000000);
      Imf_2_5::Slice::Slice
                ((Slice *)&hdr,FLOAT,(char *)inPixels._data,4,0x4f4,1,1,0.0,SUB81(in_R10,0),
                 (bool)((char)&out + '\b'));
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"X",(Slice *)&hdr);
      iVar8 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledInputFile::TiledInputFile((TiledInputFile *)&hdr,_Var6._M_p,iVar8);
      Imf_2_5::TiledInputFile::setFrameBuffer((TiledInputFile *)&hdr,(FrameBuffer *)&out);
      iVar8 = Imf_2_5::TiledInputFile::numXTiles((TiledInputFile *)&hdr,0);
      iVar9 = Imf_2_5::TiledInputFile::numYTiles((TiledInputFile *)&hdr,0);
      Imf_2_5::TiledInputFile::readTiles((TiledInputFile *)&hdr,0,iVar8 + -1,0,iVar9 + -1,0);
      Imf_2_5::TiledInputFile::~TiledInputFile((TiledInputFile *)&hdr);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&out);
      std::operator<<((ostream *)&std::cout,"comparing");
      std::ostream::flush();
      lVar18 = 0;
      for (lVar20 = 0; lVar20 != 0x21b; lVar20 = lVar20 + 1) {
        lVar23 = 0;
        while (lVar23 != 0x13d) {
          bVar7 = equivalent(*(float *)((long)inPixels._data + lVar23 * 4 + inPixels._sizeY * lVar18
                                       ),
                             *(float *)((long)outPixels._data +
                                       lVar23 * 4 + outPixels._sizeY * lVar18),CVar21);
          lVar23 = lVar23 + 1;
          if (!bVar7) {
            pcVar15 = 
            "void (anonymous namespace)::testTiledImageChannel(const char *, int, int, Compression) [OutType = float, OutTypeTag = Imf_2_5::FLOAT, InType = float, InTypeTag = Imf_2_5::FLOAT]"
            ;
LAB_00130d00:
            __assert_fail("isEquivalent (inPixels[y][x], InType (outPixels[y][x]), compression)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testConversion.cpp"
                          ,0x139,pcVar15);
          }
        }
        lVar18 = lVar18 + 4;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      remove(_Var6._M_p);
      Imf_2_5::Array2D<float>::~Array2D((Array2D<float> *)&inPixels);
      Imf_2_5::Array2D<float>::~Array2D((Array2D<float> *)&outPixels);
      std::__cxx11::string::~string((string *)&local_58);
    }
    uVar22 = (ulong)((int)uVar22 + 1);
  } while( true );
}

Assistant:

void
testConversion (const std::string &tempDir)
{
    try
    {
	cout << "Testing conversion between pixel data types" << endl;

	cout << "individual numbers" << endl;

	testNumbers();

	cout << "conversion of image channels while reading a file " << endl;

	for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
	{
	    if (comp == B44_COMPRESSION ||
                comp == B44A_COMPRESSION)
            {
		continue;
            }

	    testImageChannel <unsigned int, IMF::UINT, unsigned int, IMF::UINT>
			     (tempDir + "imf_test_conv.exr",
			      317, 539,
			      Compression (comp));

	    testImageChannel <unsigned int, IMF::UINT, half, IMF::HALF>
			     (tempDir + "imf_test_conv.exr",
			      317, 539,
			      Compression (comp));

	    testImageChannel <unsigned int, IMF::UINT, float, IMF::FLOAT>
			     (tempDir + "imf_test_conv.exr",
			      317, 539,
			      Compression (comp));

	    testImageChannel <half, IMF::HALF, unsigned int, IMF::UINT>
			     (tempDir + "imf_test_conv.exr",
			      317, 539,
			      Compression (comp));

	    testImageChannel <half, IMF::HALF, half, IMF::HALF>
			     (tempDir + "imf_test_conv.exr",
			      317, 539,
			      Compression (comp));

	    testImageChannel <half, IMF::HALF, float, IMF::FLOAT>
			     (tempDir + "imf_test_conv.exr",
			      317, 539,
			      Compression (comp));

	    testImageChannel <float, IMF::FLOAT, unsigned int, IMF::UINT>
			     (tempDir + "imf_test_conv.exr",
			      317, 539,
			      Compression (comp));

	    testImageChannel <float, IMF::FLOAT, half, IMF::HALF>
			     (tempDir + "imf_test_conv.exr",
			      317, 539,
			      Compression (comp));

	    testImageChannel <float, IMF::FLOAT, float, IMF::FLOAT>
			     (tempDir + "imf_test_conv.exr",
			      317, 539,
			      Compression (comp));

	}
	cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
	cerr << "ERROR -- caught exception: " << e.what() << endl;
	assert (false);
    }
}